

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void __thiscall Tester::compileFile(Tester *this,string *filename,Report *report)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view format_str;
  initializer_list<flow::lang::Feature> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  pointer local_668;
  shared_ptr<flow::IRProgram> programIR;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  code *local_558 [2];
  code *local_548;
  code *local_540;
  code *local_538 [2];
  code *local_528;
  code *local_520;
  code *local_518 [2];
  code *local_508;
  code *local_500;
  code *local_4f8 [2];
  code *local_4e8;
  code *local_4e0;
  code *local_4d8 [2];
  code *local_4c8;
  code *local_4c0;
  code *local_4b8 [2];
  code *local_4a8;
  code *local_4a0;
  code *local_498 [2];
  code *local_488;
  code *local_480;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Rb_tree<flow::lang::Feature,_flow::lang::Feature,_std::_Identity<flow::lang::Feature>,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
  local_458;
  IRGenerator irgen;
  Parser parser;
  PassManager pm;
  
  format_str.size_ = (size_t)filename;
  format_str.data_ = (char *)0xb;
  fmt::v5::print<std::__cxx11::string>((v5 *)"testing {}\n",format_str,in_RCX);
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x200000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&pm;
  std::
  set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>::
  set((set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
       *)&local_458,__l,(less<flow::lang::Feature> *)&irgen,(allocator_type *)&programIR);
  local_478._8_8_ = 0;
  local_460 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/fltest/main.cc:198:29)>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/fltest/main.cc:198:29)>
              ::_M_manager;
  local_478._M_unused._M_object = this;
  flow::lang::Parser::Parser
            (&parser,(set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
                      *)&local_458,report,&this->super_Runtime,(ImportHandler *)&local_478);
  std::_Function_base::~_Function_base((_Function_base *)&local_478);
  std::
  _Rb_tree<flow::lang::Feature,_flow::lang::Feature,_std::_Identity<flow::lang::Feature>,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
  ::~_Rb_tree(&local_458);
  std::make_unique<std::ifstream,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&irgen);
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)irgen.super_ASTVisitor;
  irgen.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)0x0;
  flow::lang::Parser::openStream
            (&parser,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)&pm,filename);
  if (pm.handlerPasses_.
      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
    (*(code *)(pm.handlerPasses_.
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
  }
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  if (irgen.super_ASTVisitor._vptr_ASTVisitor != (_func_int **)0x0) {
    (**(code **)(*irgen.super_ASTVisitor._vptr_ASTVisitor + 8))();
  }
  flow::lang::Parser::parse((Parser *)&local_668);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pm,"main",(allocator<char> *)&programIR);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&pm;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_650,__l_00,(allocator_type *)&program);
  flow::lang::IRGenerator::IRGenerator(&irgen,report,&local_650);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  std::__cxx11::string::~string((string *)&pm);
  flow::lang::IRGenerator::generate((IRGenerator *)&pm,(UnitSym *)&irgen);
  std::__shared_ptr<flow::IRProgram,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<flow::IRProgram,std::default_delete<flow::IRProgram>,void>
            ((__shared_ptr<flow::IRProgram,(__gnu_cxx::_Lock_policy)2> *)&programIR,
             (unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)&pm);
  std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
            ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)&pm);
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pm;
  pm.handlerPasses_.
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pm;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"eliminate-empty-blocks",(allocator<char> *)&program);
  local_498[1] = (code *)0x0;
  local_498[0] = flow::transform::emptyBlockElimination;
  local_480 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_488 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_578,(HandlerPass *)local_498);
  std::_Function_base::~_Function_base((_Function_base *)local_498);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"eliminate-linear-br",(allocator<char> *)&program);
  local_4b8[1] = (code *)0x0;
  local_4b8[0] = flow::transform::eliminateLinearBr;
  local_4a0 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_4a8 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_598,(HandlerPass *)local_4b8);
  std::_Function_base::~_Function_base((_Function_base *)local_4b8);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"eliminate-unused-blocks",(allocator<char> *)&program);
  local_4d8[1] = (code *)0x0;
  local_4d8[0] = flow::transform::eliminateUnusedBlocks;
  local_4c0 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_4c8 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_5b8,(HandlerPass *)local_4d8);
  std::_Function_base::~_Function_base((_Function_base *)local_4d8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"eliminate-unused-instr",(allocator<char> *)&program);
  local_4f8[1] = (code *)0x0;
  local_4f8[0] = flow::transform::eliminateUnusedInstr;
  local_4e0 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_4e8 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_5d8,(HandlerPass *)local_4f8);
  std::_Function_base::~_Function_base((_Function_base *)local_4f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"fold-constant-condbr",(allocator<char> *)&program);
  local_518[1] = (code *)0x0;
  local_518[0] = flow::transform::foldConstantCondBr;
  local_500 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_508 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_5f8,(HandlerPass *)local_518);
  std::_Function_base::~_Function_base((_Function_base *)local_518);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"rewrite-br-to-exit",(allocator<char> *)&program);
  local_538[1] = (code *)0x0;
  local_538[0] = flow::transform::rewriteBrToExit;
  local_520 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_528 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_618,(HandlerPass *)local_538);
  std::_Function_base::~_Function_base((_Function_base *)local_538);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"rewrite-cond-br-to-same-branches",(allocator<char> *)&program);
  local_558[1] = (code *)0x0;
  local_558[0] = flow::transform::rewriteCondBrToSameBranches;
  local_540 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_invoke;
  local_548 = std::_Function_handler<bool_(flow::IRHandler_*),_bool_(*)(flow::IRHandler_*)>::
              _M_manager;
  flow::PassManager::registerPass(&pm,&local_638,(HandlerPass *)local_558);
  std::_Function_base::~_Function_base((_Function_base *)local_558);
  std::__cxx11::string::~string((string *)&local_638);
  flow::PassManager::run
            (&pm,programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
  ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              *)&pm);
  flow::TargetCodeGenerator::TargetCodeGenerator((TargetCodeGenerator *)&pm);
  flow::TargetCodeGenerator::generate((TargetCodeGenerator *)&program,(IRProgram *)&pm);
  flow::TargetCodeGenerator::~TargetCodeGenerator((TargetCodeGenerator *)&pm);
  flow::Program::link((Program *)
                      program._M_t.
                      super___uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>._M_t
                      .super__Tuple_impl<0UL,_flow::Program_*,_std::default_delete<flow::Program>_>.
                      super__Head_base<0UL,_flow::Program_*,_false>._M_head_impl,(char *)this,
                      (char *)report);
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr(&program);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  flow::lang::IRGenerator::~IRGenerator(&irgen);
  if (local_668 != (pointer)0x0) {
    (**(code **)((local_668->_M_dataplus)._M_p + 8))();
  }
  flow::lang::Parser::~Parser(&parser);
  return;
}

Assistant:

void Tester::compileFile(const std::string& filename, flow::diagnostics::Report* report) {
  fmt::print("testing {}\n", filename);

  constexpr bool optimize = true;
  flow::lang::Parser parser{{flow::lang::Feature::GlobalScope, flow::lang::Feature::WhileLoop},
                            report,
                            this,
                            [this](auto x, auto y, auto z) { return import(x, y, z); }};
  parser.openStream(std::make_unique<std::ifstream>(filename), filename);
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  flow::lang::IRGenerator irgen(report, {"main"});
  std::shared_ptr<flow::IRProgram> programIR = irgen.generate(unit.get());

  if (optimize) {
    flow::PassManager pm;

    pm.registerPass("eliminate-empty-blocks", &flow::transform::emptyBlockElimination);
    pm.registerPass("eliminate-linear-br", &flow::transform::eliminateLinearBr);
    pm.registerPass("eliminate-unused-blocks", &flow::transform::eliminateUnusedBlocks);
    pm.registerPass("eliminate-unused-instr", &flow::transform::eliminateUnusedInstr);
    pm.registerPass("fold-constant-condbr", &flow::transform::foldConstantCondBr);
    pm.registerPass("rewrite-br-to-exit", &flow::transform::rewriteBrToExit);
    pm.registerPass("rewrite-cond-br-to-same-branches", &flow::transform::rewriteCondBrToSameBranches);

    pm.run(programIR.get());
  }

  std::unique_ptr<flow::Program> program = flow::TargetCodeGenerator().generate(programIR.get());

  program->link(this, report);

  // TODO: execute to check expected output against `output_`
  output_.clear();
}